

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O3

int wally_map_add_keypath_item
              (wally_map *map_in,uchar *pub_key,size_t pub_key_len,uchar *fingerprint,
              size_t fingerprint_len,uint32_t *path,size_t path_len)

{
  size_t size;
  int iVar1;
  int iVar2;
  uchar *value;
  size_t sVar3;
  
  iVar2 = -2;
  if (map_in != (wally_map *)0x0) {
    iVar1 = wally_ec_public_key_verify(pub_key,pub_key_len);
    if (((fingerprint_len == 4) && (fingerprint != (uchar *)0x0)) && (iVar1 == 0)) {
      if ((path != (uint32_t *)0x0) != (path_len == 0)) {
        size = path_len * 4 + 4;
        value = (uchar *)wally_malloc(size);
        if (value == (uchar *)0x0) {
          iVar2 = -3;
        }
        else {
          *(undefined4 *)value = *(undefined4 *)fingerprint;
          if (path_len != 0) {
            sVar3 = 0;
            do {
              *(uint32_t *)(value + sVar3 * 4 + 4) = path[sVar3];
              sVar3 = sVar3 + 1;
            } while (path_len != sVar3);
          }
          iVar2 = map_add(map_in,pub_key,pub_key_len,value,size,true,
                          (_func_int_uchar_ptr_size_t *)0x0,true);
          if (iVar2 == 0) {
            iVar2 = 0;
          }
          else {
            clear_and_free(value,size);
          }
        }
      }
    }
  }
  return iVar2;
}

Assistant:

int wally_map_add_keypath_item(struct wally_map *map_in,
                               const unsigned char *pub_key, size_t pub_key_len,
                               const unsigned char *fingerprint, size_t fingerprint_len,
                               const uint32_t *path, size_t path_len)
{
    unsigned char *value;
    size_t value_len, i;
    int ret;

    if (!map_in ||
        (wally_ec_public_key_verify(pub_key, pub_key_len) != WALLY_OK) ||
        !fingerprint || fingerprint_len != BIP32_KEY_FINGERPRINT_LEN ||
        BYTES_INVALID(path, path_len))
        return WALLY_EINVAL;

    value_len = fingerprint_len + path_len * sizeof(uint32_t);
    if (!(value = wally_malloc(value_len)))
        return WALLY_ENOMEM;

    memcpy(value, fingerprint, fingerprint_len);
    for (i = 0; i < path_len; ++i) {
        leint32_t tmp = cpu_to_le32(path[i]);
        memcpy(value + fingerprint_len + i * sizeof(uint32_t),
               &tmp, sizeof(tmp));
    }

    ret = map_add(map_in, pub_key, pub_key_len, value, value_len, true, NULL, true);
    if (ret != WALLY_OK)
        clear_and_free(value, value_len);
    return ret;
}